

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O2

void __thiscall
QVariantAnimationPrivate::recalculateCurrentInterval(QVariantAnimationPrivate *this,bool force)

{
  type __p;
  double dVar1;
  int iVar2;
  pair<double,_QVariant> *ppVar3;
  ulong uVar4;
  parameter_type pVar5;
  parameter_type pVar6;
  parameter_type this_00;
  const_iterator cVar7;
  long in_FS_OFFSET;
  qreal qVar8;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  pair<double,_QVariant> local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->keyValues).d.size + 1) -
      (ulong)(*(ulong *)&(this->defaultStartEndValue).d.field_0x18 < 4) < 2) goto LAB_0036d694;
  pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(&(this->super_QAbstractAnimationPrivate).direction);
  this_00 = QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
            ::value(&this->easing);
  pVar6 = QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
          ::value(&this->duration);
  if (pVar6 == 0) {
    if (pVar5 == Forward) {
      qVar8 = 1.0;
    }
    else {
      qVar8 = 0.0;
    }
  }
  else {
    iVar2 = (this->super_QAbstractAnimationPrivate).currentTime;
    pVar6 = QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
            ::value(&this->duration);
    qVar8 = (double)iVar2 / (double)pVar6;
  }
  qVar8 = QEasingCurve::valueForProgress(this_00,qVar8);
  if (((force) || ((dVar1 = (this->currentInterval).start.first, 0.0 < dVar1 && (qVar8 < dVar1))))
     || ((dVar1 = (this->currentInterval).end.first, dVar1 < 1.0 && (dVar1 < qVar8)))) {
    cVar7.i = (this->keyValues).d.ptr;
    local_78._16_8_ = 0;
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_58.second.d.data.shared = (PrivateShared *)0x0;
    local_58.second.d.data._8_8_ = 0;
    local_58.second.d.data._16_8_ = 0;
    local_58.second.d._24_8_ = 2;
    local_60 = 2;
    local_58.first = qVar8;
    cVar7 = std::
            __lower_bound<QList<std::pair<double,QVariant>>::const_iterator,std::pair<double,QVariant>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<double,QVariant>const&,std::pair<double,QVariant>const&)>>
                      (cVar7,cVar7.i + (this->keyValues).d.size,&local_58,
                       (_Iter_comp_val<bool_(*)(const_std::pair<double,_QVariant>_&,_const_std::pair<double,_QVariant>_&)>
                        )0x36d76d);
    ::QVariant::~QVariant(&local_58.second);
    ::QVariant::~QVariant((QVariant *)&local_78);
    ppVar3 = (this->keyValues).d.ptr;
    if (cVar7.i == ppVar3) {
      if ((((cVar7.i)->first != 0.0) || (NAN((cVar7.i)->first))) ||
         ((ulong)(this->keyValues).d.size < 2)) {
        local_58.first = 0.0;
        ::QVariant::QVariant(&local_58.second,&this->defaultStartEndValue);
        std::pair<double,_QVariant>::operator=(&(this->currentInterval).start,&local_58);
        ::QVariant::~QVariant(&local_58.second);
      }
      else {
        std::pair<double,_QVariant>::operator=(&(this->currentInterval).start,cVar7.i);
        cVar7.i = cVar7.i + 1;
      }
LAB_0036d679:
      std::pair<double,_QVariant>::operator=(&(this->currentInterval).end,cVar7.i);
    }
    else {
      uVar4 = (this->keyValues).d.size;
      __p = cVar7.i + -1;
      if (cVar7.i != ppVar3 + uVar4) {
        std::pair<double,_QVariant>::operator=(&(this->currentInterval).start,__p);
        goto LAB_0036d679;
      }
      if (((__p->first == 1.0) && (!NAN(__p->first))) && (1 < uVar4)) {
        std::pair<double,_QVariant>::operator=(&(this->currentInterval).start,cVar7.i + -2);
        cVar7.i = __p;
        goto LAB_0036d679;
      }
      std::pair<double,_QVariant>::operator=(&(this->currentInterval).start,__p);
      local_58.first = 1.0;
      ::QVariant::QVariant(&local_58.second,&this->defaultStartEndValue);
      std::pair<double,_QVariant>::operator=(&(this->currentInterval).end,&local_58);
      ::QVariant::~QVariant(&local_58.second);
    }
    updateInterpolator(this);
  }
  setCurrentValueForProgress(this,qVar8);
LAB_0036d694:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariantAnimationPrivate::recalculateCurrentInterval(bool force/*=false*/)
{
    // can't interpolate if we don't have at least 2 values
    if ((keyValues.size() + (defaultStartEndValue.isValid() ? 1 : 0)) < 2)
        return;

    const qreal endProgress = (direction == QAbstractAnimation::Forward) ? qreal(1) : qreal(0);
    const qreal progress = easing.value().valueForProgress(
            duration == 0 ? endProgress : qreal(currentTime) / qreal(duration));

    //0 and 1 are still the boundaries
    if (force || (currentInterval.start.first > 0 && progress < currentInterval.start.first)
        || (currentInterval.end.first < 1 && progress > currentInterval.end.first)) {
        //let's update currentInterval
        QVariantAnimation::KeyValues::const_iterator it = std::lower_bound(keyValues.constBegin(),
                                                                           keyValues.constEnd(),
                                                                           std::pair{progress, QVariant{}},
                                                                           animationValueLessThan);
        if (it == keyValues.constBegin()) {
            //the item pointed to by it is the start element in the range
            if (it->first == 0 && keyValues.size() > 1) {
                currentInterval.start = *it;
                currentInterval.end = *(it+1);
            } else {
                currentInterval.start = {qreal(0), defaultStartEndValue};
                currentInterval.end = *it;
            }
        } else if (it == keyValues.constEnd()) {
            --it; //position the iterator on the last item
            if (it->first == 1 && keyValues.size() > 1) {
                //we have an end value (item with progress = 1)
                currentInterval.start = *(it-1);
                currentInterval.end = *it;
            } else {
                //we use the default end value here
                currentInterval.start = *it;
                currentInterval.end = {qreal(1), defaultStartEndValue};
            }
        } else {
            currentInterval.start = *(it-1);
            currentInterval.end = *it;
        }

        // update all the values of the currentInterval
        updateInterpolator();
    }
    setCurrentValueForProgress(progress);
}